

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::PrgBody::assignVar(PrgBody *this,LogicProgram *prg)

{
  bool bVar1;
  ValueRep VVar2;
  uint uVar3;
  PrgAtom *this_00;
  LogicProgram *this_01;
  size_t *in_RCX;
  uchar *sig;
  ProgramBuilder *in_RSI;
  EVP_PKEY_CTX *ctx;
  PrgBody *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Literal x;
  uint32 size;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 b;
  VarType in_stack_ffffffffffffff9c;
  LogicProgram *in_stack_ffffffffffffffa0;
  Literal LVar4;
  bool local_41;
  Literal local_2c;
  uint32 local_28;
  Literal local_24;
  uint32 local_20;
  Literal local_1c;
  uint32 local_18;
  uint32 local_14;
  ProgramBuilder *local_10;
  
  local_10 = in_RSI;
  bVar1 = PrgNode::hasVar(&in_RDI->super_PrgNode);
  if ((!bVar1) && (bVar1 = PrgNode::relevant(&in_RDI->super_PrgNode), bVar1)) {
    local_14 = PrgBody::size(in_RDI);
    if ((local_14 == 0) || (VVar2 = PrgNode::value(&in_RDI->super_PrgNode), VVar2 == '\x01')) {
      LVar4.rep_ = (uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      local_18 = (uint32)lit_true();
      PrgNode::setLiteral((PrgNode *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          LVar4);
    }
    else {
      local_41 = false;
      if (local_14 == 1) {
        local_1c = goal((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        Literal::var(&local_1c);
        this_00 = LogicProgram::getAtom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        local_41 = PrgNode::hasVar((PrgNode *)this_00);
      }
      if (local_41 == false) {
        VVar2 = PrgNode::value(&in_RDI->super_PrgNode);
        if (VVar2 == '\x02') {
          lit_false();
          PrgNode::setLiteral((PrgNode *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (Literal)(uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        }
        else {
          ProgramBuilder::ctx(local_10);
          SharedContext::addVar
                    ((SharedContext *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     (uint8)((uint)in_stack_ffffffffffffff98 >> 0x18));
          LVar4.rep_ = (uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
          posLit(0x1a52ec);
          PrgNode::setLiteral((PrgNode *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),LVar4);
        }
      }
      else {
        local_24 = goal((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        Literal::var(&local_24);
        LogicProgram::getAtom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        LVar4.rep_ = (uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
        local_20 = (uint32)PrgNode::literal((PrgNode *)
                                            CONCAT44(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98));
        ctx = (EVP_PKEY_CTX *)0x0;
        local_2c = goal((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        uVar3 = Literal::sign(&local_2c,ctx,sig,in_RCX,in_R8,in_R9);
        if ((uVar3 & 1) == 0) {
          local_28 = local_20;
        }
        else {
          local_28 = (uint32)Literal::operator~((Literal *)
                                                CONCAT44(in_stack_ffffffffffffff9c,
                                                         in_stack_ffffffffffffff98));
        }
        PrgNode::setLiteral((PrgNode *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                            ,LVar4);
        b = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
        this_01 = (LogicProgram *)ProgramBuilder::ctx(local_10);
        PrgNode::var(&in_RDI->super_PrgNode);
        SharedContext::setVarEq((SharedContext *)this_01,in_stack_ffffffffffffff9c,(bool)b);
        LogicProgram::incEqs(this_01,in_stack_ffffffffffffff9c);
      }
    }
  }
  return;
}

Assistant:

void PrgBody::assignVar(LogicProgram& prg) {
	if (hasVar() || !relevant()) { return; }
	uint32 size = this->size();
	if (size == 0 || value() == value_true) {
		setLiteral(lit_true());
	}
	else if (size == 1 && prg.getAtom(goal(0).var())->hasVar()) {
		Literal x = prg.getAtom(goal(0).var())->literal();
		setLiteral(goal(0).sign() ? ~x : x);
		prg.ctx()->setVarEq(var(), true);
		prg.incEqs(Var_t::Hybrid);
	}
	else if (value() != value_false) {
		setLiteral(posLit(prg.ctx()->addVar(Var_t::Body, 0)));
	}
	else {
		setLiteral(lit_false());
	}
}